

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg-ndfs.cc
# Opt level: O3

void __thiscall
tchecker::tck_liveness::zg_ndfs::graph_t::graph_t
          (graph_t *this,shared_ptr<tchecker::zg::zg_t> *zg,size_t block_size,size_t table_size)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  node_equal_to_t local_12;
  node_hash_t local_11;
  
  graph::reachability::
  graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>
  ::graph_t(&this->
             super_graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>
            ,block_size,table_size,&local_11,&local_12);
  (this->
  super_graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>
  )._vptr_graph_t = (_func_int **)&PTR__graph_t_002480a0;
  (this->_zg).super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (zg->super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (zg->super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->_zg).super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

graph_t::graph_t(std::shared_ptr<tchecker::zg::zg_t> const & zg, std::size_t block_size, std::size_t table_size)
    : tchecker::graph::reachability::graph_t<tchecker::tck_liveness::zg_ndfs::node_t, tchecker::tck_liveness::zg_ndfs::edge_t,
                                             tchecker::tck_liveness::zg_ndfs::node_hash_t,
                                             tchecker::tck_liveness::zg_ndfs::node_equal_to_t>(
          block_size, table_size, tchecker::tck_liveness::zg_ndfs::node_hash_t(),
          tchecker::tck_liveness::zg_ndfs::node_equal_to_t()),
      _zg(zg)
{
}